

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageRestrictionManager.cpp
# Opt level: O2

void __thiscall
jaegertracing::thrift::BaggageRestrictionManagerClient::recv_getBaggageRestrictions
          (BaggageRestrictionManagerClient *this,
          vector<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
          *_return)

{
  int iVar1;
  TApplicationException *pTVar2;
  int32_t *__nbytes;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  allocator local_95;
  TMessageType mtype;
  TApplicationException x;
  BaggageRestrictionManager_getBaggageRestrictions_presult result;
  int32_t rseqid;
  string fname;
  
  __nbytes = &rseqid;
  rseqid = 0;
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  (*this->iprot_->_vptr_TProtocol[0x17])(this->iprot_,&fname,&mtype);
  if (mtype != T_REPLY) {
    if (mtype == T_EXCEPTION) {
      x.super_TException.message_._M_dataplus._M_p = (pointer)&x.super_TException.message_.field_2;
      x.super_TException.message_._M_string_length = 0;
      x.super_TException.message_.field_2._M_local_buf[0] = '\0';
      x.super_TException._0_8_ = &PTR__TException_00299778;
      x.type_ = UNKNOWN;
      apache::thrift::TApplicationException::read(&x,(int)this->iprot_,__buf,0x299778);
      (*this->iprot_->_vptr_TProtocol[0x18])();
      std::__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                    *)&result,
                   &(this->iprot_->ptrans_).
                    super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                  );
      (**(code **)(*result._vptr_BaggageRestrictionManager_getBaggageRestrictions_presult + 0x40))()
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&result.success);
      pTVar2 = (TApplicationException *)__cxa_allocate_exception(0x30);
      apache::thrift::TApplicationException::TApplicationException(pTVar2,&x);
      __cxa_throw(pTVar2,&apache::thrift::TApplicationException::typeinfo,
                  apache::thrift::TException::~TException);
    }
    (*this->iprot_->_vptr_TProtocol[0x2c])(this->iprot_,0xc);
    (*this->iprot_->_vptr_TProtocol[0x18])();
    std::__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> *)
                 &x,&(this->iprot_->ptrans_).
                     super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                );
    (**(code **)(*(long *)x.super_TException._0_8_ + 0x40))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&x.super_TException.message_);
  }
  iVar1 = std::__cxx11::string::compare((char *)&fname);
  __buf_00 = extraout_RDX;
  if (iVar1 != 0) {
    (*this->iprot_->_vptr_TProtocol[0x2c])(this->iprot_,0xc);
    (*this->iprot_->_vptr_TProtocol[0x18])();
    std::__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> *)
                 &x,&(this->iprot_->ptrans_).
                     super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                );
    (**(code **)(*(long *)x.super_TException._0_8_ + 0x40))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&x.super_TException.message_);
    __buf_00 = extraout_RDX_00;
  }
  result._vptr_BaggageRestrictionManager_getBaggageRestrictions_presult =
       (_func_int **)&PTR__BaggageRestrictionManager_getBaggageRestrictions_presult_00299e18;
  result.__isset = (_BaggageRestrictionManager_getBaggageRestrictions_presult__isset)0x0;
  result.success = _return;
  BaggageRestrictionManager_getBaggageRestrictions_presult::read
            (&result,(int)this->iprot_,__buf_00,(size_t)__nbytes);
  (*this->iprot_->_vptr_TProtocol[0x18])();
  std::__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> *)&x,
             &(this->iprot_->ptrans_).
              super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>)
  ;
  (**(code **)(*(long *)x.super_TException._0_8_ + 0x40))();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&x.super_TException.message_);
  if (((byte)result.__isset & 1) != 0) {
    BaggageRestrictionManager_getBaggageRestrictions_presult::
    ~BaggageRestrictionManager_getBaggageRestrictions_presult(&result);
    std::__cxx11::string::~string((string *)&fname);
    return;
  }
  pTVar2 = (TApplicationException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&x,"getBaggageRestrictions failed: unknown result",&local_95);
  apache::thrift::TApplicationException::TApplicationException(pTVar2,MISSING_RESULT,(string *)&x);
  __cxa_throw(pTVar2,&apache::thrift::TApplicationException::typeinfo,
              apache::thrift::TException::~TException);
}

Assistant:

void BaggageRestrictionManagerClient::recv_getBaggageRestrictions(std::vector<BaggageRestriction> & _return)
{

  int32_t rseqid = 0;
  std::string fname;
  ::apache::thrift::protocol::TMessageType mtype;

  iprot_->readMessageBegin(fname, mtype, rseqid);
  if (mtype == ::apache::thrift::protocol::T_EXCEPTION) {
    ::apache::thrift::TApplicationException x;
    x.read(iprot_);
    iprot_->readMessageEnd();
    iprot_->getTransport()->readEnd();
    throw x;
  }
  if (mtype != ::apache::thrift::protocol::T_REPLY) {
    iprot_->skip(::apache::thrift::protocol::T_STRUCT);
    iprot_->readMessageEnd();
    iprot_->getTransport()->readEnd();
  }
  if (fname.compare("getBaggageRestrictions") != 0) {
    iprot_->skip(::apache::thrift::protocol::T_STRUCT);
    iprot_->readMessageEnd();
    iprot_->getTransport()->readEnd();
  }
  BaggageRestrictionManager_getBaggageRestrictions_presult result;
  result.success = &_return;
  result.read(iprot_);
  iprot_->readMessageEnd();
  iprot_->getTransport()->readEnd();

  if (result.__isset.success) {
    // _return pointer has now been filled
    return;
  }
  throw ::apache::thrift::TApplicationException(::apache::thrift::TApplicationException::MISSING_RESULT, "getBaggageRestrictions failed: unknown result");
}